

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O2

int MakeGenericMessage(http_method_t method,char *url_str,membuffer *request,uri_type *url,
                      int contentLength,char *contentType,UpnpString *headers)

{
  size_t sVar1;
  int iVar2;
  size_t urlstrlen;
  char *pcVar3;
  undefined8 in_stack_ffffffffffffffa8;
  size_t hostlen;
  char *local_40;
  char *hoststr;
  
  hostlen = 0;
  local_40 = contentType;
  UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x3ef,"URL: %s method: %d\n"
             ,url_str,CONCAT44((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),method));
  urlstrlen = strlen(url_str);
  iVar2 = http_FixStrUrl(url_str,urlstrlen,url);
  if (iVar2 != 0) {
    return iVar2;
  }
  membuffer_init(request);
  iVar2 = http_MakeMessage(request,1,1,"Q",(ulong)method,(url->pathquery).buff,(url->pathquery).size
                          );
  if (iVar2 == 0) {
    if (headers == (UpnpString *)0x0) {
      iVar2 = get_hoststr(url_str,&hoststr,&hostlen);
      sVar1 = hostlen;
      if (iVar2 != 0) {
        return iVar2;
      }
      UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x40e,
                 "HOSTNAME : %s Length : %zu\n",hoststr,hostlen);
      iVar2 = http_MakeMessage(request,1,1,"sbcDCU","HOST: ",hoststr,sVar1);
    }
    else {
      pcVar3 = UpnpString_get_String(headers);
      iVar2 = http_MakeMessage(request,1,1,"s",pcVar3);
    }
    if ((local_40 != (char *)0x0) && (iVar2 == 0)) {
      iVar2 = http_MakeMessage(request,1,1,"T");
    }
    if (iVar2 == 0) {
      if (contentLength < 0) {
        if (contentLength == -4) {
          pcVar3 = "c";
        }
        else {
          if (contentLength != -3) {
            iVar2 = -0x65;
            goto LAB_00118cea;
          }
          pcVar3 = "Kc";
        }
        iVar2 = http_MakeMessage(request,1,1,pcVar3);
      }
      else {
        iVar2 = http_MakeMessage(request,1,1,"Nc",(ulong)(uint)contentLength);
      }
      if (iVar2 == 0) {
        UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x439,
                   "HTTP Buffer:\n%s\n----------END--------\n",request->buf);
        return 0;
      }
    }
  }
LAB_00118cea:
  UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x431,
             "HTTP Makemessage failed\n");
  membuffer_destroy(request);
  return iVar2;
}

Assistant:

int MakeGenericMessage(http_method_t method,
	const char *url_str,
	membuffer *request,
	uri_type *url,
	int contentLength,
	const char *contentType,
	const UpnpString *headers)
{
	int ret_code = 0;
	size_t hostlen = 0;
	const char *hoststr;

	UpnpPrintf(UPNP_INFO,
		HTTP,
		__FILE__,
		__LINE__,
		"URL: %s method: %d\n",
		url_str,
		method);
	ret_code = http_FixStrUrl(url_str, strlen(url_str), url);
	if (ret_code != UPNP_E_SUCCESS)
		return ret_code;
	/* make msg */
	membuffer_init(request);
	ret_code = http_MakeMessage(request,
		1,
		1,
		"Q",
		method,
		url->pathquery.buff,
		url->pathquery.size);
	/* add request headers if specified, otherwise use default headers */
	if (ret_code == 0) {
		if (headers) {
			ret_code = http_MakeMessage(request,
				1,
				1,
				"s",
				UpnpString_get_String(headers));
		} else {
			ret_code = get_hoststr(url_str, &hoststr, &hostlen);
			if (ret_code != UPNP_E_SUCCESS)
				return ret_code;
			UpnpPrintf(UPNP_INFO,
				HTTP,
				__FILE__,
				__LINE__,
				"HOSTNAME : %s Length : %" PRIzu "\n",
				hoststr,
				hostlen);
			ret_code = http_MakeMessage(request,
				1,
				1,
				"s"
				"bcDCU",
				"HOST: ",
				hoststr,
				hostlen);
		}
	}

	/* add the content-type header */
	if (ret_code == 0 && contentType) {
		ret_code = http_MakeMessage(request, 1, 1, "T", contentType);
	}
	/* add content-length header. */
	if (ret_code == 0) {
		if (contentLength >= 0)
			ret_code = http_MakeMessage(
				request, 1, 1, "Nc", (off_t)contentLength);
		else if (contentLength == UPNP_USING_CHUNKED)
			ret_code = http_MakeMessage(request, 1, 1, "Kc");
		else if (contentLength == UPNP_UNTIL_CLOSE)
			ret_code = http_MakeMessage(request, 1, 1, "c");
		else
			ret_code = UPNP_E_INVALID_PARAM;
	}
	if (ret_code != 0) {
		UpnpPrintf(UPNP_INFO,
			HTTP,
			__FILE__,
			__LINE__,
			"HTTP Makemessage failed\n");
		membuffer_destroy(request);
		return ret_code;
	}
	UpnpPrintf(UPNP_INFO,
		HTTP,
		__FILE__,
		__LINE__,
		"HTTP Buffer:\n%s\n"
		"----------END--------\n",
		request->buf);

	return UPNP_E_SUCCESS;
}